

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O1

int proc_spawn_sync(char **args)

{
  pid_t pid;
  __pid_t _Var1;
  int iVar2;
  int wstatus;
  uint local_c;
  
  pid = proc_spawn(args);
  local_c = 0;
  _Var1 = waitpid(0,(int *)&local_c,0);
  if (_Var1 < 0) {
    proc_spawn_sync_cold_1();
  }
  else if (((local_c & 0x7f) == 0) || (0x1ffffff < (int)((local_c & 0x7f) * 0x1000000 + 0x1000000)))
  {
    iVar2 = wstatus_to_exit_status(pid,local_c);
    return iVar2;
  }
  __assert_fail("WIFEXITED(wstatus) || WIFSIGNALED(wstatus)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/tools/perfprof/proc.c"
                ,0x69,"int proc_spawn_sync(char *const *)");
}

Assistant:

int proc_spawn_sync(char *const args[]) {
    pid_t pid = proc_spawn(args);
    int wstatus = 0;
    int w = waitpid(0, &wstatus, 0);
    if (w < 0) {
        perror("waitpid");
        exit(EXIT_FAILURE);
    }

    assert(WIFEXITED(wstatus) || WIFSIGNALED(wstatus));
    return wstatus_to_exit_status(pid, wstatus);
}